

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env.cpp
# Opt level: O0

void GF2::Env::RandMem(void *pMem,size_t size)

{
  u32 uVar1;
  ulong in_RSI;
  u32 *in_RDI;
  u32 rnd;
  size_t i;
  u32 *pMem32;
  u32 local_24;
  long local_20;
  u32 *local_18;
  ulong local_10;
  
  if (in_RSI != 0) {
    local_18 = in_RDI;
    local_10 = in_RSI;
    for (local_20 = 0; local_20 + 1U < local_10 >> 2; local_20 = local_20 + 1) {
      uVar1 = Rand();
      *local_18 = uVar1;
      local_18 = local_18 + 1;
    }
    local_24 = Rand();
    local_10 = local_10 & 3;
    if (local_10 == 0) {
      *local_18 = local_24;
    }
    else {
      memcpy(local_18,&local_24,local_10);
    }
  }
  return;
}

Assistant:

void Env::RandMem(void* pMem, size_t size)
{
	if (size == 0) return;
	u32* pMem32 = (u32*)pMem;
	// заполняем все слова, кроме последнего (возможно неполного)
	for (size_t i = 0; i + 1 < size / 4; *(pMem32++) = Rand(), ++i);
	// заполняем последнее слово
	u32 rnd = Rand();
	if (size %= 4)
		::memcpy(pMem32, &rnd, size);
	else
		*pMem32 = rnd;
}